

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

void lj_tab_resize(lua_State *L,GCtab *t,uint32_t asize,uint32_t hbits)

{
  uint uVar1;
  uint64_t uVar2;
  void *pvVar3;
  void *pvVar4;
  undefined8 *puVar5;
  uint64_t uVar6;
  TValue *pTVar7;
  TValue *pTVar8;
  uint uVar9;
  uint uVar10;
  TValue *oarray;
  ulong uVar11;
  ulong uVar12;
  
  uVar2 = (t->node).ptr64;
  uVar10 = t->asize;
  uVar11 = (ulong)uVar10;
  uVar1 = t->hmask;
  if (uVar10 < asize) {
    if (0x8000001 < asize) goto LAB_00128f4a;
    pvVar4 = (void *)(t->array).ptr64;
    if (t->colo < '\x01') {
      pvVar3 = lj_mem_realloc(L,pvVar4,uVar11 * 8,(ulong)(asize * 8));
    }
    else {
      pvVar3 = lj_mem_realloc(L,(void *)0x0,0,(ulong)(asize * 8));
      t->colo = t->colo | 0x80;
      if (uVar11 != 0) {
        uVar12 = 0;
        do {
          *(undefined8 *)((long)pvVar3 + uVar12 * 8) = *(undefined8 *)((long)pvVar4 + uVar12 * 8);
          uVar12 = uVar12 + 1;
        } while (uVar11 != uVar12);
      }
    }
    (t->array).ptr64 = (uint64_t)pvVar3;
    t->asize = asize;
    if (uVar10 < asize) {
      memset((void *)((long)pvVar3 + uVar11 * 8),0xff,(ulong)(~uVar10 + asize) * 8 + 8);
    }
  }
  if (hbits == 0) {
    uVar6 = (L->glref).ptr64 + 0xf8;
    (t->node).ptr64 = uVar6;
    (t->freetop).ptr64 = uVar6;
    t->hmask = 0;
  }
  else {
    if (0x1a < hbits) {
LAB_00128f4a:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    uVar9 = 1 << ((byte)hbits & 0x1f);
    uVar12 = (ulong)uVar9;
    pvVar4 = lj_mem_realloc(L,(void *)0x0,0,0x18L << ((byte)hbits & 0x3f));
    (t->node).ptr64 = (uint64_t)pvVar4;
    (t->freetop).ptr64 = (uint64_t)((long)pvVar4 + uVar12 * 0x18);
    t->hmask = uVar9 - 1;
    puVar5 = (undefined8 *)((long)pvVar4 + 0x10);
    do {
      *puVar5 = 0;
      *(undefined4 *)(puVar5 + -2) = 0xffffffff;
      *(undefined4 *)((long)puVar5 + -0xc) = 0xffffffff;
      *(undefined4 *)(puVar5 + -1) = 0xffffffff;
      *(undefined4 *)((long)puVar5 + -4) = 0xffffffff;
      puVar5 = puVar5 + 3;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  if (asize < uVar10) {
    pvVar4 = (void *)(t->array).ptr64;
    t->asize = asize;
    uVar12 = (ulong)asize;
    do {
      if (*(long *)((long)pvVar4 + uVar12 * 8) != -1) {
        pTVar7 = lj_tab_setinth(L,t,(int32_t)uVar12);
        *pTVar7 = *(TValue *)((long)pvVar4 + uVar12 * 8);
      }
      uVar12 = uVar12 + 1;
    } while (uVar11 != uVar12);
    if (t->colo < '\x01') {
      pvVar4 = lj_mem_realloc(L,pvVar4,uVar11 << 3,(ulong)asize << 3);
      (t->array).ptr64 = (uint64_t)pvVar4;
    }
  }
  if (uVar1 == 0) {
    return;
  }
  uVar11 = 0;
  do {
    if (*(long *)(uVar2 + uVar11 * 0x18) != -1) {
      pTVar7 = (TValue *)(uVar2 + uVar11 * 0x18);
      pTVar8 = lj_tab_set(L,t,pTVar7 + 1);
      *pTVar8 = *pTVar7;
    }
    uVar10 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar10;
  } while (uVar10 <= uVar1);
  puVar5 = (undefined8 *)(L->glref).ptr64;
  puVar5[2] = puVar5[2] + (ulong)(uVar1 + 1) * -0x18;
  (*(code *)*puVar5)(puVar5[1],uVar2,(ulong)(uVar1 + 1) * 0x18,0,(code *)*puVar5);
  return;
}

Assistant:

void lj_tab_resize(lua_State *L, GCtab *t, uint32_t asize, uint32_t hbits)
{
  Node *oldnode = noderef(t->node);
  uint32_t oldasize = t->asize;
  uint32_t oldhmask = t->hmask;
  if (asize > oldasize) {  /* Array part grows? */
    TValue *array;
    uint32_t i;
    if (asize > LJ_MAX_ASIZE)
      lj_err_msg(L, LJ_ERR_TABOV);
    if (LJ_MAX_COLOSIZE != 0 && t->colo > 0) {
      /* A colocated array must be separated and copied. */
      TValue *oarray = tvref(t->array);
      array = lj_mem_newvec(L, asize, TValue);
      t->colo = (int8_t)(t->colo | 0x80);  /* Mark as separated (colo < 0). */
      for (i = 0; i < oldasize; i++)
	copyTV(L, &array[i], &oarray[i]);
    } else {
      array = (TValue *)lj_mem_realloc(L, tvref(t->array),
			  oldasize*sizeof(TValue), asize*sizeof(TValue));
    }
    setmref(t->array, array);
    t->asize = asize;
    for (i = oldasize; i < asize; i++)  /* Clear newly allocated slots. */
      setnilV(&array[i]);
  }
  /* Create new (empty) hash part. */
  if (hbits) {
    newhpart(L, t, hbits);
    clearhpart(t);
  } else {
    global_State *g = G(L);
    setmref(t->node, &g->nilnode);
#if LJ_GC64
    setmref(t->freetop, &g->nilnode);
#endif
    t->hmask = 0;
  }
  if (asize < oldasize) {  /* Array part shrinks? */
    TValue *array = tvref(t->array);
    uint32_t i;
    t->asize = asize;  /* Note: This 'shrinks' even colocated arrays. */
    for (i = asize; i < oldasize; i++)  /* Reinsert old array values. */
      if (!tvisnil(&array[i]))
	copyTV(L, lj_tab_setinth(L, t, (int32_t)i), &array[i]);
    /* Physically shrink only separated arrays. */
    if (LJ_MAX_COLOSIZE != 0 && t->colo <= 0)
      setmref(t->array, lj_mem_realloc(L, array,
	      oldasize*sizeof(TValue), asize*sizeof(TValue)));
  }
  if (oldhmask > 0) {  /* Reinsert pairs from old hash part. */
    global_State *g;
    uint32_t i;
    for (i = 0; i <= oldhmask; i++) {
      Node *n = &oldnode[i];
      if (!tvisnil(&n->val))
	copyTV(L, lj_tab_set(L, t, &n->key), &n->val);
    }
    g = G(L);
    lj_mem_freevec(g, oldnode, oldhmask+1, Node);
  }
}